

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O2

bool __thiscall
OSSLRSA::reconstructPrivateKey(OSSLRSA *this,PrivateKey **ppPrivateKey,ByteString *serialisedData)

{
  char cVar1;
  size_t sVar2;
  OSSLRSAPrivateKey *this_00;
  
  if ((ppPrivateKey != (PrivateKey **)0x0) && (sVar2 = ByteString::size(serialisedData), sVar2 != 0)
     ) {
    this_00 = (OSSLRSAPrivateKey *)operator_new(0x150);
    OSSLRSAPrivateKey::OSSLRSAPrivateKey(this_00);
    cVar1 = (**(code **)(*(long *)&this_00->super_RSAPrivateKey + 0xc0))(this_00,serialisedData);
    if (cVar1 != '\0') {
      *ppPrivateKey = (PrivateKey *)this_00;
      return true;
    }
    (**(code **)(*(long *)&this_00->super_RSAPrivateKey + 0x10))(this_00);
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructPrivateKey(PrivateKey** ppPrivateKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPrivateKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLRSAPrivateKey* priv = new OSSLRSAPrivateKey();

	if (!priv->deserialise(serialisedData))
	{
		delete priv;

		return false;
	}

	*ppPrivateKey = priv;

	return true;
}